

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

io_context * gmlc::networking::AsioContextManager::getContext(string *contextName)

{
  io_context *piVar1;
  string *in_stack_00000058;
  
  getContextPointer(in_stack_00000058);
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6e3675);
  piVar1 = getBaseContext((AsioContextManager *)0x6e367d);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x6e368e);
  return piVar1;
}

Assistant:

asio::io_context& AsioContextManager::getContext(const std::string& contextName)
{
    return getContextPointer(contextName)->getBaseContext();
}